

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

KNearestNeighborsClassifier *
buildBasicNearestNeighborClassifier
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,char *outTensorName)

{
  int iVar1;
  ModelDescription *pMVar2;
  Type *pTVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  StringFeatureType *this;
  KNearestNeighborsClassifier *pKVar6;
  Int64Parameter *pIVar7;
  Int64Set *pIVar8;
  NearestNeighborsIndex *pNVar9;
  SingleKdTreeIndex *this_00;
  SquaredEuclideanDistance *this_01;
  Type *pTVar10;
  UniformWeighting *this_02;
  StringVector *pSVar11;
  int iVar12;
  Type local_50;
  
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(m->description_->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar3,inTensorAttr->name);
  if (pTVar3->type_ == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar4);
    pTVar3->type_ = pFVar4;
  }
  pFVar4 = pTVar3->type_;
  if (pFVar4->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 5;
    pAVar5 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar5);
    (pFVar4->Type_).multiarraytype_ = pAVar5;
  }
  pAVar5 = (pFVar4->Type_).multiarraytype_;
  pAVar5->datatype_ = 0x10020;
  if (0 < inTensorAttr->dimension) {
    iVar12 = 0;
    do {
      iVar1 = (pAVar5->shape_).total_size_;
      if ((pAVar5->shape_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<long>::Reserve(&pAVar5->shape_,iVar1 + 1);
      }
      iVar1 = (pAVar5->shape_).current_size_;
      (pAVar5->shape_).current_size_ = iVar1 + 1;
      ((pAVar5->shape_).rep_)->elements[iVar1] = 1;
      iVar12 = iVar12 + 1;
    } while (iVar12 < inTensorAttr->dimension);
  }
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&(m->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::set_name(pTVar3,outTensorName);
  if (pTVar3->type_ == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar4);
    pTVar3->type_ = pFVar4;
  }
  pFVar4 = pTVar3->type_;
  if (pFVar4->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar4);
    pFVar4->_oneof_case_[0] = 3;
    this = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(this);
    (pFVar4->Type_).stringtype_ = this;
  }
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  CoreML::Specification::ModelDescription::set_predictedfeaturename(m->description_,outTensorName);
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0x194;
    pKVar6 = (KNearestNeighborsClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier(pKVar6);
    (m->Type_).knearestneighborsclassifier_ = pKVar6;
  }
  pKVar6 = (m->Type_).knearestneighborsclassifier_;
  if (pKVar6->numberofneighbors_ == (Int64Parameter *)0x0) {
    pIVar7 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar7);
    pKVar6->numberofneighbors_ = pIVar7;
  }
  pIVar7 = pKVar6->numberofneighbors_;
  if (pIVar7->_oneof_case_[0] != 0xb) {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(pIVar7);
    pIVar7->_oneof_case_[0] = 0xb;
    pIVar8 = (Int64Set *)operator_new(0x28);
    CoreML::Specification::Int64Set::Int64Set(pIVar8);
    (pIVar7->AllowedValues_).set_ = pIVar8;
  }
  pIVar8 = (pIVar7->AllowedValues_).set_;
  iVar12 = (pIVar8->values_).total_size_;
  if ((pIVar8->values_).current_size_ == iVar12) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar8->values_,iVar12 + 1);
  }
  iVar12 = (pIVar8->values_).current_size_;
  (pIVar8->values_).current_size_ = iVar12 + 1;
  ((pIVar8->values_).rep_)->elements[iVar12] = 3;
  if (pKVar6->numberofneighbors_ == (Int64Parameter *)0x0) {
    pIVar7 = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(pIVar7);
    pKVar6->numberofneighbors_ = pIVar7;
  }
  pKVar6->numberofneighbors_->defaultvalue_ = 3;
  if (pKVar6->nearestneighborsindex_ == (NearestNeighborsIndex *)0x0) {
    pNVar9 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(pNVar9);
    pKVar6->nearestneighborsindex_ = pNVar9;
  }
  pNVar9 = pKVar6->nearestneighborsindex_;
  if (pNVar9->_oneof_case_[0] != 0x6e) {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(pNVar9);
    pNVar9->_oneof_case_[0] = 0x6e;
    this_00 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_00);
    (pNVar9->IndexType_).singlekdtreeindex_ = this_00;
  }
  ((pNVar9->IndexType_).linearindex_)->_cached_size_ = 0x1e;
  if (pNVar9->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(pNVar9);
    pNVar9->_oneof_case_[1] = 200;
    this_01 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_01);
    (pNVar9->DistanceFunction_).squaredeuclideandistance_ = this_01;
  }
  pNVar9->numberofdimensions_ = inTensorAttr->dimension;
  iVar12 = 0;
  pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                      (&(pNVar9->floatsamples_).super_RepeatedPtrFieldBase,(Type *)0x0);
  if (0 < inTensorAttr->dimension) {
    do {
      iVar1 = (pTVar10->vector_).total_size_;
      if ((pTVar10->vector_).current_size_ == iVar1) {
        google::protobuf::RepeatedField<float>::Reserve(&pTVar10->vector_,iVar1 + 1);
      }
      iVar1 = (pTVar10->vector_).current_size_;
      (pTVar10->vector_).current_size_ = iVar1 + 1;
      ((pTVar10->vector_).rep_)->elements[iVar1] = (float)iVar12;
      iVar12 = iVar12 + 1;
    } while (iVar12 < inTensorAttr->dimension);
  }
  if (pKVar6->_oneof_case_[2] != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme(pKVar6);
    pKVar6->_oneof_case_[2] = 200;
    this_02 = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this_02);
    (pKVar6->WeightingScheme_).uniformweighting_ = this_02;
  }
  if (pKVar6->_oneof_case_[0] != 100) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_ClassLabels(pKVar6);
    pKVar6->_oneof_case_[0] = 100;
    pSVar11 = (StringVector *)operator_new(0x30);
    CoreML::Specification::StringVector::StringVector(pSVar11);
    (pKVar6->ClassLabels_).stringclasslabels_ = pSVar11;
  }
  pSVar11 = (pKVar6->ClassLabels_).stringclasslabels_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"zero","");
  google::protobuf::internal::RepeatedPtrFieldBase::
  Add<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(pSVar11->vector_).super_RepeatedPtrFieldBase,&local_50,(enable_if<true,_void> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return pKVar6;
}

Assistant:

Specification::KNearestNeighborsClassifier* buildBasicNearestNeighborClassifier(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const char *outTensorName) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorName);
    outTensor->mutable_type()->mutable_stringtype();
    
    m.mutable_description()->set_predictedfeaturename(outTensorName);
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto nearestNeighborClassifier = m.mutable_knearestneighborsclassifier();
    int numberOfNeighbors = 3;
    nearestNeighborClassifier->mutable_numberofneighbors()->mutable_set()->add_values(numberOfNeighbors);
    nearestNeighborClassifier->mutable_numberofneighbors()->set_defaultvalue(numberOfNeighbors);

    auto nearestNeighborIndex = nearestNeighborClassifier->mutable_nearestneighborsindex();
    
    nearestNeighborIndex->mutable_singlekdtreeindex()->set_leafsize(30);
    nearestNeighborIndex->mutable_squaredeuclideandistance();
    
    nearestNeighborIndex->set_numberofdimensions(inTensorAttr->dimension);
    
    auto floatVector = nearestNeighborIndex->add_floatsamples();
    auto pointVector = floatVector->mutable_vector();
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        pointVector->Add((float)i);
    }
    
    nearestNeighborClassifier->mutable_uniformweighting();
    nearestNeighborClassifier->mutable_stringclasslabels()->add_vector(std::string("zero"));
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return nearestNeighborClassifier;
}